

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q8_1_ref(float *x,block_q8_1 *y,int64_t k)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int j;
  long lVar6;
  ushort uVar7;
  float fVar8;
  int8_t *piVar9;
  ulong uVar10;
  uint uVar11;
  anon_union_4_2_5fd15f10 fp32_5;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  anon_union_4_2_5fd15f10 fp32;
  float fVar23;
  
  lVar6 = k + 0x1f;
  if (-1 < k) {
    lVar6 = k;
  }
  uVar11 = (uint)(lVar6 >> 5);
  if (0 < (int)uVar11) {
    piVar9 = y->qs + 0x10;
    uVar10 = 0;
    do {
      lVar6 = 0;
      fVar23 = 0.0;
      do {
        if (fVar23 <= ABS(x[lVar6])) {
          fVar23 = ABS(x[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x20);
      fVar23 = fVar23 / 127.0;
      fVar8 = (float)(((uint)fVar23 & 0x7f800000) + 0x7800000);
      if ((uint)((int)fVar23 * 2) < 0x71000000) {
        fVar8 = 2.0;
      }
      fVar8 = fVar8 + ABS(fVar23) * 5.192297e+33 * 7.70372e-34;
      uVar7 = (SUB42(fVar8,0) & 0xfff) + ((ushort)((uint)fVar8 >> 0xd) & 0x7c00);
      if (0xff000000 < (uint)((int)fVar23 * 2)) {
        uVar7 = 0x7e00;
      }
      y[uVar10].field_0.field_0.d = uVar7 | (ushort)((uint)fVar23 >> 0x10) & 0x8000;
      fVar8 = (float)(-(uint)(fVar23 != 0.0) & (uint)(1.0 / fVar23));
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      iVar22 = 0;
      lVar6 = 0;
      do {
        pfVar1 = x + lVar6;
        fVar14 = *pfVar1;
        fVar15 = pfVar1[1];
        fVar13 = pfVar1[2];
        pfVar2 = x + lVar6 + 0x10;
        fVar16 = *pfVar2;
        fVar3 = pfVar2[1];
        fVar4 = pfVar2[2];
        fVar5 = pfVar2[3];
        fVar12 = roundf(pfVar1[3] * fVar8);
        fVar13 = roundf(fVar13 * fVar8);
        fVar14 = roundf(fVar14 * fVar8);
        fVar15 = roundf(fVar15 * fVar8);
        auVar18._0_4_ = (int)fVar14;
        auVar18._4_4_ = (int)fVar15;
        auVar18._8_4_ = (int)fVar13;
        auVar18._12_4_ = (int)fVar12;
        auVar17 = packssdw(auVar18,auVar18);
        auVar17 = packsswb(auVar17,auVar17);
        *(int *)(piVar9 + lVar6 + -0x10) = auVar17._0_4_;
        fVar14 = roundf(fVar5 * fVar8);
        fVar15 = roundf(fVar4 * fVar8);
        fVar13 = roundf(fVar16 * fVar8);
        fVar16 = roundf(fVar3 * fVar8);
        auVar17._0_4_ = (int)fVar13;
        auVar17._4_4_ = (int)fVar16;
        auVar17._8_4_ = (int)fVar15;
        auVar17._12_4_ = (int)fVar14;
        iVar19 = iVar19 + auVar18._0_4_ + auVar17._0_4_;
        iVar20 = iVar20 + auVar18._4_4_ + auVar17._4_4_;
        iVar21 = iVar21 + auVar18._8_4_ + auVar17._8_4_;
        iVar22 = iVar22 + auVar18._12_4_ + auVar17._12_4_;
        auVar18 = packssdw(auVar17,auVar17);
        auVar18 = packsswb(auVar18,auVar18);
        *(int *)(piVar9 + lVar6) = auVar18._0_4_;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      fVar23 = fVar23 * (float)(iVar22 + iVar20 + iVar21 + iVar19);
      fVar8 = (float)(((uint)fVar23 & 0x7f800000) + 0x7800000);
      if ((uint)((int)fVar23 * 2) < 0x71000000) {
        fVar8 = 2.0;
      }
      fVar8 = fVar8 + ABS(fVar23) * 5.192297e+33 * 7.70372e-34;
      uVar7 = (SUB42(fVar8,0) & 0xfff) + ((ushort)((uint)fVar8 >> 0xd) & 0x7c00);
      if (0xff000000 < (uint)((int)fVar23 * 2)) {
        uVar7 = 0x7e00;
      }
      y[uVar10].field_0.field_0.s = uVar7 | (ushort)((uint)fVar23 >> 0x10) & 0x8000;
      uVar10 = uVar10 + 1;
      x = x + 0x20;
      piVar9 = piVar9 + 0x24;
    } while (uVar10 != (uVar11 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q8_1_ref(const float * GGML_RESTRICT x, block_q8_1 * GGML_RESTRICT y, int64_t k) {
    assert(QK8_1 == 32);
    assert(k % QK8_1 == 0);
    const int nb = k / QK8_1;

    for (int i = 0; i < nb; i++) {
        float amax = 0.0f; // absolute max

        for (int j = 0; j < QK8_1; j++) {
            const float v = x[i*QK8_1 + j];
            amax = MAX(amax, fabsf(v));
        }

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        int sum = 0;

        for (int j = 0; j < QK8_1/2; ++j) {
            const float v0 = x[i*QK8_1           + j]*id;
            const float v1 = x[i*QK8_1 + QK8_1/2 + j]*id;

            y[i].qs[          j] = roundf(v0);
            y[i].qs[QK8_1/2 + j] = roundf(v1);

            sum += y[i].qs[          j];
            sum += y[i].qs[QK8_1/2 + j];
        }

        y[i].s = GGML_FP32_TO_FP16(sum*d);
    }
}